

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O0

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollerUtilsImpl::RemapOperands
          (LoopUnrollerUtilsImpl *this,Instruction *inst)

{
  function<void_(unsigned_int_*)> local_40;
  anon_class_8_1_8991fb9c local_20;
  anon_class_8_1_8991fb9c remap_operands_to_new_ids;
  Instruction *inst_local;
  LoopUnrollerUtilsImpl *this_local;
  
  local_20.this = this;
  remap_operands_to_new_ids.this = (LoopUnrollerUtilsImpl *)inst;
  std::function<void(unsigned_int*)>::
  function<spvtools::opt::(anonymous_namespace)::LoopUnrollerUtilsImpl::RemapOperands(spvtools::opt::Instruction*)::__0&,void>
            ((function<void(unsigned_int*)> *)&local_40,&local_20);
  Instruction::ForEachInId(inst,&local_40);
  std::function<void_(unsigned_int_*)>::~function(&local_40);
  IRContext::AnalyzeUses(this->context_,(Instruction *)remap_operands_to_new_ids.this);
  return;
}

Assistant:

void LoopUnrollerUtilsImpl::RemapOperands(Instruction* inst) {
  auto remap_operands_to_new_ids = [this](uint32_t* id) {
    auto itr = state_.new_inst.find(*id);

    if (itr != state_.new_inst.end()) {
      *id = itr->second;
    }
  };

  inst->ForEachInId(remap_operands_to_new_ids);
  context_->AnalyzeUses(inst);
}